

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O0

void __thiscall
COLLADABU::Math::Matrix3::fromEulerAnglesZXY
          (Matrix3 *this,Real *fYAngle_radian,Real *fPAngle_radian,Real *fRAngle_radian)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  Matrix3 *in_RDI;
  Matrix3 kYMat;
  Matrix3 kXMat;
  Matrix3 kZMat;
  Real fSin;
  Real fCos;
  Matrix3 *rkMatrix;
  Matrix3 *in_stack_fffffffffffffe80;
  Matrix3 *in_stack_fffffffffffffe88;
  Matrix3 local_108;
  Matrix3 local_c0;
  Matrix3 local_78;
  double local_30;
  Matrix3 *local_28;
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (Matrix3 *)cos(*in_RSI);
  local_30 = sin(*local_10);
  Matrix3(&local_78,(Real)local_28,-local_30,0.0,local_30,(Real)local_28,0.0,0.0,0.0,1.0);
  local_28 = (Matrix3 *)cos(*local_18);
  local_30 = sin(*local_18);
  Matrix3(&local_c0,1.0,0.0,0.0,0.0,(Real)local_28,-local_30,0.0,local_30,(Real)local_28);
  local_28 = (Matrix3 *)cos(*local_20);
  local_30 = sin(*local_20);
  rkMatrix = local_28;
  Matrix3(&local_108,(Real)local_28,0.0,local_30,0.0,1.0,0.0,-local_30,0.0,(Real)local_28);
  operator*(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator*(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator=(in_RDI,rkMatrix);
  return;
}

Assistant:

void Matrix3::fromEulerAnglesZXY ( const Real& fYAngle_radian, const Real& fPAngle_radian,
                                           const Real& fRAngle_radian )
        {
            Real fCos, fSin;

            fCos = cos( fYAngle_radian );
            fSin = sin( fYAngle_radian );
            Matrix3 kZMat( fCos, -fSin, 0.0, fSin, fCos, 0.0, 0.0, 0.0, 1.0 );

            fCos = cos( fPAngle_radian );
            fSin = sin( fPAngle_radian );
            Matrix3 kXMat( 1.0, 0.0, 0.0, 0.0, fCos, -fSin, 0.0, fSin, fCos );

            fCos = cos( fRAngle_radian );
            fSin = sin( fRAngle_radian );
            Matrix3 kYMat( fCos, 0.0, fSin, 0.0, 1.0, 0.0, -fSin, 0.0, fCos );

            *this = kZMat * ( kXMat * kYMat );
        }